

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::RegisterMulticastListener
          (CommissionerImpl *this,Handler<uint8_t> *aHandler,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  int iVar4;
  Error *pEVar5;
  char *pcVar6;
  function<void_(const_unsigned_char_*,_ot::commissioner::Error)> *this_00;
  char *pcVar7;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer aIp;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  undefined1 local_238 [8];
  _Alloc_hider _Stack_230;
  undefined1 local_228 [24];
  parse_func local_210 [1];
  CommissionerImpl *local_200;
  undefined1 local_1f8 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  string local_1d0;
  uint32_t local_1ac;
  writer write;
  Error error;
  Address multicastAddr;
  ByteArray rawAddresses;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  this_01 = (string *)local_238;
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  multicastAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  multicastAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  multicastAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200 = this;
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            (&onResponse.aHandler,aHandler);
  aIp = (aMulticastAddrList->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (aMulticastAddrList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (aIp == pbVar3) {
    local_238._0_4_ = none_type;
    _Stack_230._M_p = "Multicast Address List cannot be empty";
    local_228._0_8_ = 0x26;
    local_228._8_8_ = 0;
    local_210[0] = (parse_func)0x0;
    pcVar6 = "Multicast Address List cannot be empty";
    local_228._16_8_ = local_238;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_238;
    while (pcVar6 != "") {
      cVar1 = *pcVar6;
      pcVar7 = pcVar6;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar6,"");
          goto LAB_0019ac56;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar6,pcVar7);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar7,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_238);
    }
LAB_0019ac56:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_238;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"Multicast Address List cannot be empty",(string_view)ZEXT816(0x26)
               ,args);
    local_1f8._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)&local_1f0,(string *)&local_1d0);
LAB_0019ac88:
    Error::operator=(&error,(Error *)local_1f8);
    std::__cxx11::string::~string((string *)&local_1f0);
    this_01 = &local_1d0;
  }
  else {
    local_1ac = aTimeout;
LAB_0019ab35:
    if (aIp != pbVar3) {
      Address::Set((Error *)local_238,&multicastAddr,aIp);
      pEVar5 = Error::operator=(&error,(Error *)local_238);
      EVar2 = pEVar5->mCode;
      std::__cxx11::string::~string((string *)&_Stack_230);
      if (EVar2 == kNone) {
        if (((multicastAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              multicastAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start) &&
            ((long)multicastAddr.mBytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)multicastAddr.mBytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10)) &&
           (*multicastAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start == 0xff)) goto code_r0x0019aba2;
        local_238._0_4_ = string_type;
        _Stack_230._M_p = "{} is not a valid IPv6 multicast address";
        local_228._0_8_ = 0x28;
        local_228._8_8_ = 0x100000000;
        local_210[0] = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar6 = "{} is not a valid IPv6 multicast address";
        local_228._16_8_ = local_238;
        write.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_238;
        while (pcVar6 != "") {
          cVar1 = *pcVar6;
          pcVar7 = pcVar6;
          while (cVar1 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&write,pcVar6,"");
              goto LAB_0019ad54;
            }
            cVar1 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&write,pcVar6,pcVar7);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar7,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_238);
        }
LAB_0019ad54:
        Address::ToString_abi_cxx11_((string *)local_238,&multicastAddr);
        write.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(local_238._4_4_,local_238._0_4_);
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&write;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x28;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_1d0,(v10 *)"{} is not a valid IPv6 multicast address",fmt,args_00);
        local_1f8._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)&local_1f0,(string *)&local_1d0);
        Error::operator=(&error,(Error *)local_1f8);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        goto LAB_0019adcb;
      }
      goto LAB_0019add0;
    }
    iVar4 = (*(local_200->super_Commissioner)._vptr_Commissioner[9])();
    if ((char)iVar4 == '\0') {
      local_238._0_4_ = none_type;
      _Stack_230._M_p = "the commissioner is not active";
      local_228._0_8_ = 0x1e;
      local_228._8_8_ = 0;
      local_210[0] = (parse_func)0x0;
      pcVar6 = "the commissioner is not active";
      local_228._16_8_ = local_238;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_238);
        }
      }
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_238;
      ::fmt::v10::vformat_abi_cxx11_(&local_1d0,(v10 *)0x2157e0,(string_view)ZEXT816(0x1e),args_01);
      local_1f8._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_1f0,(string *)&local_1d0);
      goto LAB_0019ac88;
    }
    std::__cxx11::string::string((string *)local_1f8,"/n/mr",(allocator *)&local_1d0);
    coap::Message::SetUriPath((Error *)local_238,&request,(string *)local_1f8);
    pEVar5 = Error::operator=(&error,(Error *)local_238);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&_Stack_230);
    std::__cxx11::string::~string((string *)local_1f8);
    if (EVar2 != kNone) goto LAB_0019add0;
    iVar4 = (*(local_200->super_Commissioner)._vptr_Commissioner[7])();
    tlv::Tlv::Tlv((Tlv *)local_1f8,kCommissionerUdpPort,(uint16_t)iVar4,kThread);
    AppendTlv((Error *)local_238,&request,(Tlv *)local_1f8);
    pEVar5 = Error::operator=(&error,(Error *)local_238);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&_Stack_230);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
    if (EVar2 != kNone) goto LAB_0019add0;
    tlv::Tlv::Tlv((Tlv *)local_1f8,kCommissionerSessionId,local_1ac,kThread);
    AppendTlv((Error *)local_238,&request,(Tlv *)local_1f8);
    pEVar5 = Error::operator=(&error,(Error *)local_238);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&_Stack_230);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
    if (EVar2 != kNone) goto LAB_0019add0;
    tlv::Tlv::Tlv((Tlv *)local_1f8,kActiveTimestamp,&rawAddresses,kThread);
    AppendTlv((Error *)local_238,&request,(Tlv *)local_1f8);
    pEVar5 = Error::operator=(&error,(Error *)local_238);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&_Stack_230);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
    if (EVar2 != kNone) goto LAB_0019add0;
    iVar4 = (*(local_200->super_Commissioner)._vptr_Commissioner[10])();
    if ((char)iVar4 != '\0') {
      SignRequest((Error *)local_238,local_200,&request,kMeshCoP,true);
      pEVar5 = Error::operator=(&error,(Error *)local_238);
      EVar2 = pEVar5->mCode;
      std::__cxx11::string::~string((string *)&_Stack_230);
      if (EVar2 != kNone) goto LAB_0019add0;
    }
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    this_00 = (function<void_(const_unsigned_char_*,_ot::commissioner::Error)> *)operator_new(0x20);
    std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
              (this_00,&onResponse.aHandler);
    pcStack_110 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1090:23)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1090:23)>
                ::_M_manager;
    local_128._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&local_200->mProxyClient,&request,(ResponseHandler *)&local_128,0xfc38,0xf0bf);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    std::__cxx11::string::string((string *)local_1f8,"mgmt",(allocator *)&write);
    local_238._0_4_ = none_type;
    _Stack_230._M_p = "sent MLR.req";
    local_228._0_8_ = 0xc;
    local_228._8_8_ = 0;
    local_210[0] = (parse_func)0x0;
    pcVar6 = "sent MLR.req";
    local_228._16_8_ = local_238;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_238);
      }
    }
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_238;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"sent MLR.req",(string_view)ZEXT816(0xc),args_02);
    Log(kDebug,(string *)local_1f8,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_01 = (string *)local_1f8;
  }
LAB_0019adcb:
  std::__cxx11::string::~string((string *)this_01);
LAB_0019add0:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::operator()
              (aHandler,(uchar *)0x0,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&multicastAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
code_r0x0019aba2:
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&rawAddresses,
             (const_iterator)
             rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )multicastAddr.mBytes.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )multicastAddr.mBytes.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  aIp = aIp + 1;
  goto LAB_0019ab35;
}

Assistant:

void CommissionerImpl::RegisterMulticastListener(Handler<uint8_t>                aHandler,
                                                 const std::vector<std::string> &aMulticastAddrList,
                                                 uint32_t                        aTimeout)
{
    Error     error;
    Address   multicastAddr;
    ByteArray rawAddresses;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error       error;
        tlv::TlvPtr statusTlv = nullptr;
        uint8_t     status;

        SuccessOrExit(error = aError);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
        LOG_INFO(LOG_REGION_THCI, "received MLR.rsp: {}", utils::Hex(aResponse->GetPayload()));
#endif

        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        statusTlv = GetTlv(tlv::Type::kThreadStatus, *aResponse, tlv::Scope::kThread);
        VerifyOrExit(statusTlv != nullptr, error = ERROR_BAD_FORMAT("no valid State TLV found in response"));

        status = statusTlv->GetValueAsUint8();
        aHandler(&status, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(!aMulticastAddrList.empty(), error = ERROR_INVALID_ARGS("Multicast Address List cannot be empty"));

    for (const auto &addr : aMulticastAddrList)
    {
        SuccessOrExit(error = multicastAddr.Set(addr));
        VerifyOrExit(multicastAddr.IsIpv6() && multicastAddr.IsMulticast(),
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 multicast address", multicastAddr.ToString()));
        rawAddresses.insert(rawAddresses.end(), multicastAddr.GetRaw().begin(), multicastAddr.GetRaw().end());
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMlr));
    SuccessOrExit(
        error = AppendTlv(request, {tlv::Type::kThreadCommissionerSessionId, GetSessionId(), tlv::Scope::kThread}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kThreadTimeout, aTimeout, tlv::Scope::kThread}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kThreadIpv6Addresses, rawAddresses, tlv::Scope::kThread}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, kPrimaryBbrAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MLR.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}